

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::ConvertLatin1ToUTF8(StringPiece *latin1,string *utf)

{
  int iVar1;
  size_t i;
  ulong uVar2;
  Rune r;
  char buf [4];
  uint local_30;
  char local_2c [4];
  
  utf->_M_string_length = 0;
  *(utf->_M_dataplus)._M_p = '\0';
  for (uVar2 = 0; uVar2 < latin1->size_; uVar2 = uVar2 + 1) {
    local_30 = (uint)(byte)latin1->data_[uVar2];
    iVar1 = runetochar(local_2c,(Rune *)&local_30);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (utf,local_2c,(long)iVar1);
  }
  return;
}

Assistant:

void ConvertLatin1ToUTF8(const StringPiece& latin1, std::string* utf) {
  char buf[UTFmax];

  utf->clear();
  for (size_t i = 0; i < latin1.size(); i++) {
    Rune r = latin1[i] & 0xFF;
    int n = runetochar(buf, &r);
    utf->append(buf, n);
  }
}